

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rounded_box.cxx
# Opt level: O0

void fl_rshadow_box(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color c_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  fl_color(0x27);
  rbox(1,x + 3,y + 3,w,h);
  rbox(0,x + 3,y + 3,w,h);
  fl_rounded_box(x,y,w,h,c);
  return;
}

Assistant:

static void fl_rshadow_box(int x, int y, int w, int h, Fl_Color c) {
  // draw shadow:
  fl_color(FL_DARK3);
  rbox(1, x+BW, y+BW, w, h);
  rbox(0, x+BW, y+BW, w, h);
  // draw the box:
  fl_rounded_box(x, y, w, h, c);
}